

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

node_t_conflict type_qual(c2m_ctx_t c2m_ctx,int no_err_p)

{
  parse_ctx *ppVar1;
  node_code_t nc;
  int iVar2;
  node_t_conflict pnVar3;
  pos_t p;
  pos_t pos;
  
  ppVar1 = c2m_ctx->parse_ctx;
  iVar2 = match(c2m_ctx,0x11e,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if (iVar2 == 0) {
    iVar2 = match(c2m_ctx,0x12e,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
    if (iVar2 == 0) {
      iVar2 = match(c2m_ctx,0x13b,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar2 == 0) {
        iVar2 = match(c2m_ctx,0x114,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
        if (iVar2 == 0) {
          if (ppVar1->record_level != 0) {
            return &err_struct;
          }
          syntax_error(c2m_ctx,"a type qualifier");
          return &err_struct;
        }
        nc = N_ATOMIC;
      }
      else {
        nc = N_VOLATILE;
      }
    }
    else {
      nc = N_RESTRICT;
    }
  }
  else {
    nc = N_CONST;
  }
  p.lno = pos.lno;
  p.ln_pos = pos.ln_pos;
  p.fname = pos.fname;
  pnVar3 = new_pos_node(c2m_ctx,nc,p);
  return pnVar3;
}

Assistant:

D (type_qual) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t r;
  pos_t pos;

  if (MP (T_CONST, pos)) {
    r = new_pos_node (c2m_ctx, N_CONST, pos);
  } else if (MP (T_RESTRICT, pos)) {
    r = new_pos_node (c2m_ctx, N_RESTRICT, pos);
  } else if (MP (T_VOLATILE, pos)) {
    r = new_pos_node (c2m_ctx, N_VOLATILE, pos);
  } else if (MP (T_ATOMIC, pos)) {
    r = new_pos_node (c2m_ctx, N_ATOMIC, pos);
  } else {
    if (record_level == 0) syntax_error (c2m_ctx, "a type qualifier");
    r = err_node;
  }
  return r;
}